

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O3

void opj_mct_decode_real(OPJ_FLOAT32 *c0,OPJ_FLOAT32 *c1,OPJ_FLOAT32 *c2,OPJ_SIZE_T n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ulong uVar13;
  
  if (7 < n) {
    uVar13 = n >> 3;
    do {
      fVar1 = (float)*c0;
      fVar2 = ((float *)c0)[1];
      fVar3 = ((float *)c0)[2];
      fVar4 = ((float *)c0)[3];
      fVar5 = (float)*c1;
      fVar6 = ((float *)c1)[1];
      fVar7 = ((float *)c1)[2];
      fVar8 = ((float *)c1)[3];
      fVar9 = (float)*c2;
      fVar10 = ((float *)c2)[1];
      fVar11 = ((float *)c2)[2];
      fVar12 = ((float *)c2)[3];
      *c0 = (OPJ_FLOAT32)(fVar9 * 1.402 + fVar1);
      ((float *)c0)[1] = fVar10 * 1.402 + fVar2;
      ((float *)c0)[2] = fVar11 * 1.402 + fVar3;
      ((float *)c0)[3] = fVar12 * 1.402 + fVar4;
      *c1 = (OPJ_FLOAT32)((fVar1 - fVar5 * 0.34413) - fVar9 * 0.71414);
      ((float *)c1)[1] = (fVar2 - fVar6 * 0.34413) - fVar10 * 0.71414;
      ((float *)c1)[2] = (fVar3 - fVar7 * 0.34413) - fVar11 * 0.71414;
      ((float *)c1)[3] = (fVar4 - fVar8 * 0.34413) - fVar12 * 0.71414;
      *c2 = (OPJ_FLOAT32)(fVar5 * 1.772 + fVar1);
      ((float *)c2)[1] = fVar6 * 1.772 + fVar2;
      ((float *)c2)[2] = fVar7 * 1.772 + fVar3;
      ((float *)c2)[3] = fVar8 * 1.772 + fVar4;
      fVar1 = ((float *)c0)[4];
      fVar2 = ((float *)c0)[5];
      fVar3 = ((float *)c0)[6];
      fVar4 = ((float *)c0)[7];
      fVar5 = ((float *)c1)[4];
      fVar6 = ((float *)c1)[5];
      fVar7 = ((float *)c1)[6];
      fVar8 = ((float *)c1)[7];
      fVar9 = ((float *)c2)[4];
      fVar10 = ((float *)c2)[5];
      fVar11 = ((float *)c2)[6];
      fVar12 = ((float *)c2)[7];
      ((float *)c0)[4] = fVar9 * 1.402 + fVar1;
      ((float *)c0)[5] = fVar10 * 1.402 + fVar2;
      ((float *)c0)[6] = fVar11 * 1.402 + fVar3;
      ((float *)c0)[7] = fVar12 * 1.402 + fVar4;
      ((float *)c1)[4] = (fVar1 - fVar5 * 0.34413) - fVar9 * 0.71414;
      ((float *)c1)[5] = (fVar2 - fVar6 * 0.34413) - fVar10 * 0.71414;
      ((float *)c1)[6] = (fVar3 - fVar7 * 0.34413) - fVar11 * 0.71414;
      ((float *)c1)[7] = (fVar4 - fVar8 * 0.34413) - fVar12 * 0.71414;
      ((float *)c2)[4] = fVar5 * 1.772 + fVar1;
      ((float *)c2)[5] = fVar6 * 1.772 + fVar2;
      ((float *)c2)[6] = fVar7 * 1.772 + fVar3;
      ((float *)c2)[7] = fVar8 * 1.772 + fVar4;
      c0 = (OPJ_FLOAT32 *)((float *)c0 + 8);
      c1 = (OPJ_FLOAT32 *)((float *)c1 + 8);
      c2 = (OPJ_FLOAT32 *)((float *)c2 + 8);
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  if ((n & 7) != 0) {
    uVar13 = 0;
    do {
      fVar1 = ((float *)c0)[uVar13];
      fVar2 = ((float *)c1)[uVar13];
      fVar3 = ((float *)c2)[uVar13];
      ((float *)c0)[uVar13] = fVar3 * 1.402 + fVar1;
      ((float *)c1)[uVar13] = fVar3 * -0.71414 + fVar2 * -0.34413 + fVar1;
      ((float *)c2)[uVar13] = fVar2 * 1.772 + fVar1;
      uVar13 = uVar13 + 1;
    } while ((n & 7) != uVar13);
  }
  return;
}

Assistant:

void opj_mct_decode_real(
    OPJ_FLOAT32* OPJ_RESTRICT c0,
    OPJ_FLOAT32* OPJ_RESTRICT c1,
    OPJ_FLOAT32* OPJ_RESTRICT c2,
    OPJ_SIZE_T n)
{
    OPJ_SIZE_T i;
#ifdef __SSE__
    __m128 vrv, vgu, vgv, vbu;
    vrv = _mm_set1_ps(1.402f);
    vgu = _mm_set1_ps(0.34413f);
    vgv = _mm_set1_ps(0.71414f);
    vbu = _mm_set1_ps(1.772f);
    for (i = 0; i < (n >> 3); ++i) {
        __m128 vy, vu, vv;
        __m128 vr, vg, vb;

        vy = _mm_load_ps(c0);
        vu = _mm_load_ps(c1);
        vv = _mm_load_ps(c2);
        vr = _mm_add_ps(vy, _mm_mul_ps(vv, vrv));
        vg = _mm_sub_ps(_mm_sub_ps(vy, _mm_mul_ps(vu, vgu)), _mm_mul_ps(vv, vgv));
        vb = _mm_add_ps(vy, _mm_mul_ps(vu, vbu));
        _mm_store_ps(c0, vr);
        _mm_store_ps(c1, vg);
        _mm_store_ps(c2, vb);
        c0 += 4;
        c1 += 4;
        c2 += 4;

        vy = _mm_load_ps(c0);
        vu = _mm_load_ps(c1);
        vv = _mm_load_ps(c2);
        vr = _mm_add_ps(vy, _mm_mul_ps(vv, vrv));
        vg = _mm_sub_ps(_mm_sub_ps(vy, _mm_mul_ps(vu, vgu)), _mm_mul_ps(vv, vgv));
        vb = _mm_add_ps(vy, _mm_mul_ps(vu, vbu));
        _mm_store_ps(c0, vr);
        _mm_store_ps(c1, vg);
        _mm_store_ps(c2, vb);
        c0 += 4;
        c1 += 4;
        c2 += 4;
    }
    n &= 7;
#endif
    for (i = 0; i < n; ++i) {
        OPJ_FLOAT32 y = c0[i];
        OPJ_FLOAT32 u = c1[i];
        OPJ_FLOAT32 v = c2[i];
        OPJ_FLOAT32 r = y + (v * 1.402f);
        OPJ_FLOAT32 g = y - (u * 0.34413f) - (v * (0.71414f));
        OPJ_FLOAT32 b = y + (u * 1.772f);
        c0[i] = r;
        c1[i] = g;
        c2[i] = b;
    }
}